

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelmapped.cpp
# Opt level: O3

void __thiscall
TPZGeoElMapped<TPZGeoElRefPattern<pzgeom::TPZGeoTriangle>_>::TPZGeoElMapped
          (TPZGeoElMapped<TPZGeoElRefPattern<pzgeom::TPZGeoTriangle>_> *this,TPZGeoMesh *destmesh,
          TPZGeoElMapped<TPZGeoElRefPattern<pzgeom::TPZGeoTriangle>_> *copy,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcNdIdx,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcElIdx)

{
  double *pdVar1;
  
  *(undefined ***)
   &(this->super_TPZGeoElRefPattern<pzgeom::TPZGeoTriangle>).
    super_TPZGeoElRefLess<pzgeom::TPZGeoTriangle>.super_TPZGeoEl = &PTR__TPZSavable_01905418;
  TPZGeoElRefPattern<pzgeom::TPZGeoTriangle>::TPZGeoElRefPattern
            (&this->super_TPZGeoElRefPattern<pzgeom::TPZGeoTriangle>,&PTR_PTR_019049a0,destmesh,
             &copy->super_TPZGeoElRefPattern<pzgeom::TPZGeoTriangle>,gl2lcNdIdx,gl2lcElIdx);
  *(undefined ***)
   &(this->super_TPZGeoElRefPattern<pzgeom::TPZGeoTriangle>).
    super_TPZGeoElRefLess<pzgeom::TPZGeoTriangle>.super_TPZGeoEl = &PTR__TPZGeoElMapped_01904690;
  pdVar1 = (this->fCornerCo).fBuf;
  (this->fCornerCo).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
  (this->fCornerCo).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
  (this->fCornerCo).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed
       = '\0';
  (this->fCornerCo).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
  fDefPositive = '\0';
  (this->fCornerCo).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_01883a30;
  (this->fCornerCo).super_TPZFMatrix<double>.fElem = pdVar1;
  (this->fCornerCo).super_TPZFMatrix<double>.fGiven = pdVar1;
  (this->fCornerCo).super_TPZFMatrix<double>.fSize = 6;
  TPZVec<int>::TPZVec(&(this->fCornerCo).super_TPZFMatrix<double>.fPivot.super_TPZVec<int>,0);
  (this->fCornerCo).super_TPZFMatrix<double>.fPivot.super_TPZVec<int>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_01815498;
  (this->fCornerCo).super_TPZFMatrix<double>.fPivot.super_TPZVec<int>.fStore =
       (this->fCornerCo).super_TPZFMatrix<double>.fPivot.fExtAlloc;
  (this->fCornerCo).super_TPZFMatrix<double>.fPivot.super_TPZVec<int>.fNElements = 0;
  (this->fCornerCo).super_TPZFMatrix<double>.fPivot.super_TPZVec<int>.fNAlloc = 0;
  (this->fCornerCo).super_TPZFMatrix<double>.fWork._vptr_TPZVec =
       (_func_int **)&PTR__TPZVec_01813df0;
  (this->fCornerCo).super_TPZFMatrix<double>.fWork.fStore = (double *)0x0;
  (this->fCornerCo).super_TPZFMatrix<double>.fWork.fNElements = 0;
  (this->fCornerCo).super_TPZFMatrix<double>.fWork.fNAlloc = 0;
  (this->fCornerCo).super_TPZFMatrix<double>.fElem = (double *)0x0;
  (this->fCornerCo).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFNMatrix_01883740;
  TPZFMatrix<double>::operator=
            (&(this->fCornerCo).super_TPZFMatrix<double>,&(copy->fCornerCo).super_TPZFMatrix<double>
            );
  return;
}

Assistant:

TPZGeoElMapped<TBase>::TPZGeoElMapped(TPZGeoMesh &destmesh, const TPZGeoElMapped<TBase> &copy, std::map<int64_t,int64_t> &gl2lcNdIdx,
                                      std::map<int64_t,int64_t> &gl2lcElIdx) : 
TPZRegisterClassId(&TPZGeoElMapped::ClassId),TBase(destmesh,copy,gl2lcNdIdx,gl2lcElIdx),
    fCornerCo(copy.fCornerCo)
{
    
}